

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttpost.c
# Opt level: O2

FT_Error load_post_names(TT_Face face)

{
  FT_Stream stream;
  byte bVar1;
  FT_UShort FVar2;
  FT_Int n;
  FT_Error FVar3;
  FT_ULong FVar4;
  FT_Byte *pFVar5;
  FT_Char *pFVar6;
  long lVar7;
  long lVar8;
  FT_Memory memory;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  FT_UShort n_1;
  ulong uVar12;
  FT_Char **ppFVar13;
  ulong new_count;
  FT_ULong local_78;
  FT_ULong post_len;
  ulong local_68;
  ulong local_60;
  FT_Memory local_58;
  FT_Byte *local_50;
  FT_UShort local_42;
  FT_Char **local_40;
  FT_Error local_34;
  
  stream = (face->root).stream;
  FVar3 = (*face->goto_table)(face,0x706f7374,stream,&local_78);
  if (FVar3 != 0) {
    return FVar3;
  }
  FVar4 = FT_Stream_Pos(stream);
  uVar11 = FVar4 + local_78;
  lVar7 = (face->postscript).FormatType;
  FVar3 = FT_Stream_Skip(stream,0x20);
  if (FVar3 != 0) {
    return FVar3;
  }
  if (lVar7 != 0x25000) {
    if (lVar7 == 0x20000) {
      memory = stream->memory;
      local_42 = FT_Stream_ReadUShort(stream,&local_34);
      FVar3 = local_34;
      if (local_34 != 0) goto LAB_00219094;
      if (local_42 <= (face->max_profile).numGlyphs) {
        local_40 = (FT_Char **)(ulong)local_42;
        pFVar5 = (FT_Byte *)ft_mem_realloc(memory,2,0,(FT_Long)local_40,(void *)0x0,&local_34);
        ppFVar13 = (FT_Char **)0x0;
        if (local_34 == 0) {
          local_50 = pFVar5;
          local_34 = FT_Stream_EnterFrame(stream,(ulong)(uint)((int)local_40 * 2));
          if (local_34 == 0) {
            for (ppFVar13 = (FT_Char **)0x0; local_40 != ppFVar13;
                ppFVar13 = (FT_Char **)((long)ppFVar13 + 1)) {
              FVar2 = FT_Stream_GetUShort(stream);
              *(FT_UShort *)(local_50 + (long)ppFVar13 * 2) = FVar2;
            }
            local_58 = memory;
            FT_Stream_ExitFrame(stream);
            ppFVar13 = (FT_Char **)0x0;
            uVar10 = 0;
            while( true ) {
              new_count = uVar10 & 0xffff;
              if (local_40 == ppFVar13) break;
              uVar9 = *(ushort *)(local_50 + (long)ppFVar13 * 2) - 0x101;
              uVar10 = (ulong)uVar9;
              if ((int)uVar9 <= (int)new_count) {
                uVar10 = new_count;
              }
              if (*(ushort *)(local_50 + (long)ppFVar13 * 2) < 0x102) {
                uVar10 = new_count;
              }
              ppFVar13 = (FT_Char **)((long)ppFVar13 + 1);
            }
            ppFVar13 = (FT_Char **)ft_mem_realloc(local_58,8,0,new_count,(void *)0x0,&local_34);
            memory = local_58;
            pFVar5 = local_50;
            local_40 = ppFVar13;
            if (local_34 == 0) {
              for (local_68 = 0; new_count != local_68; local_68 = local_68 + 1) {
                FVar4 = FT_Stream_Pos(stream);
                if (uVar11 <= FVar4) {
                  uVar11 = new_count;
                  uVar12 = local_68;
                  if (new_count < local_68) {
                    uVar11 = local_68;
                  }
                  goto LAB_00219018;
                }
                bVar1 = FT_Stream_ReadChar(stream,&local_34);
                if (local_34 != 0) goto LAB_0021904f;
                uVar12 = (ulong)bVar1;
                if ((uVar11 < uVar12) ||
                   (post_len = uVar11 - uVar12, local_60 = uVar12, FVar4 = FT_Stream_Pos(stream),
                   post_len < FVar4)) {
                  FVar4 = FT_Stream_Pos(stream);
                  uVar9 = (int)uVar11 - (int)FVar4;
                  local_60 = (ulong)uVar9;
                  if ((int)uVar9 < 1) {
                    local_60 = 0;
                  }
                }
                pFVar5 = (FT_Byte *)
                         ft_mem_realloc(local_58,1,0,(ulong)((int)local_60 + 1),(void *)0x0,
                                        &local_34);
                local_40[local_68] = (FT_Char *)pFVar5;
                if (local_34 != 0) goto LAB_0021904f;
                local_60 = local_60 & 0xffffffff;
                local_34 = FT_Stream_Read(stream,pFVar5,local_60);
                if (local_34 != 0) goto LAB_0021904f;
                local_40[local_68][local_60] = '\0';
              }
LAB_002190aa:
              (face->postscript_names).names.format_20.num_glyphs = local_42;
              (face->postscript_names).names.format_20.num_names = (FT_UShort)uVar10;
              (face->postscript_names).names.format_25.offsets = (FT_Char *)local_50;
              (face->postscript_names).names.format_20.glyph_names = local_40;
LAB_00218f2d:
              FVar3 = 0;
              goto LAB_00219094;
            }
          }
          else {
            ppFVar13 = (FT_Char **)0x0;
            pFVar5 = local_50;
          }
        }
        goto LAB_0021907e;
      }
    }
    FVar3 = 3;
    goto LAB_00219094;
  }
  memory = stream->memory;
  FVar2 = FT_Stream_ReadUShort(stream,&local_34);
  FVar3 = local_34;
  if (((local_34 != 0) || (FVar3 = 3, 0x102 < FVar2)) ||
     ((face->max_profile).numGlyphs <= (ushort)(FVar2 - 1))) goto LAB_00219094;
  local_40 = (FT_Char **)(ulong)FVar2;
  pFVar5 = (FT_Byte *)ft_mem_realloc(memory,1,0,(FT_Long)local_40,(void *)0x0,&local_34);
  if ((local_34 == 0) &&
     (local_34 = FT_Stream_Read(stream,pFVar5,(FT_ULong)local_40), local_34 == 0)) {
    lVar7 = -1;
    do {
      if (lVar7 - (long)local_40 == -1) {
        (face->postscript_names).names.format_20.num_glyphs = FVar2;
        (face->postscript_names).names.format_25.offsets = (FT_Char *)pFVar5;
        goto LAB_00218f2d;
      }
      lVar8 = (char)pFVar5[lVar7 + 1] + lVar7;
      lVar7 = lVar7 + 1;
    } while ((FT_Char **)(lVar8 + 1) <= local_40);
    local_34 = 3;
  }
LAB_0021908c:
  ft_mem_free(memory,pFVar5);
  FVar3 = local_34;
LAB_00219094:
  (face->postscript_names).loaded = '\x01';
  return FVar3;
LAB_00219018:
  if (uVar11 == uVar12) goto LAB_002190aa;
  pFVar6 = (FT_Char *)ft_mem_realloc(local_58,1,0,1,(void *)0x0,&local_34);
  local_40[uVar12] = pFVar6;
  if (local_34 != 0) goto LAB_0021904f;
  *pFVar6 = '\0';
  uVar12 = uVar12 + 1;
  goto LAB_00219018;
LAB_0021904f:
  ppFVar13 = local_40;
  memory = local_58;
  for (uVar11 = 0; pFVar5 = local_50, new_count != uVar11; uVar11 = uVar11 + 1) {
    ft_mem_free(memory,ppFVar13[uVar11]);
    ppFVar13[uVar11] = (FT_Char *)0x0;
  }
LAB_0021907e:
  ft_mem_free(memory,ppFVar13);
  goto LAB_0021908c;
}

Assistant:

static FT_Error
  load_post_names( TT_Face  face )
  {
    FT_Stream  stream;
    FT_Error   error;
    FT_Fixed   format;
    FT_ULong   post_len;
    FT_ULong   post_limit;


    /* get a stream for the face's resource */
    stream = face->root.stream;

    /* seek to the beginning of the PS names table */
    error = face->goto_table( face, TTAG_post, stream, &post_len );
    if ( error )
      goto Exit;

    post_limit = FT_STREAM_POS() + post_len;

    format = face->postscript.FormatType;

    /* go to beginning of subtable */
    if ( FT_STREAM_SKIP( 32 ) )
      goto Exit;

    /* now read postscript table */
    if ( format == 0x00020000L )
      error = load_format_20( face, stream, post_limit );
    else if ( format == 0x00025000L )
      error = load_format_25( face, stream, post_limit );
    else
      error = FT_THROW( Invalid_File_Format );

    face->postscript_names.loaded = 1;

  Exit:
    return error;
  }